

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O2

void __thiscall
cppcms::impl::buddy_allocator::buddy_allocator(buddy_allocator *this,size_t memory_size)

{
  uint uVar1;
  long lVar2;
  buddy_allocator *pbVar3;
  size_t n;
  buddy_allocator *pbVar4;
  
  n = memory_size - 0x220;
  this->memory_size_ = n;
  this->max_bit_size_ = -1;
  memset(this,0,0x200);
  pbVar4 = this + 1;
  while( true ) {
    uVar1 = containts_bits(n);
    if ((int)uVar1 < 5) break;
    lVar2 = 1L << ((byte)uVar1 & 0x3f);
    n = n - lVar2;
    pbVar3 = (buddy_allocator *)((long)pbVar4->free_list_ + lVar2);
    *(uint *)pbVar4->free_list_ = uVar1;
    pbVar4->free_list_[1] = (page *)0x0;
    pbVar4->free_list_[2] = (page *)0x0;
    this->free_list_[uVar1] = (page *)pbVar4;
    pbVar4 = pbVar3;
    if (this->max_bit_size_ == -1) {
      this->max_bit_size_ = uVar1;
    }
  }
  return;
}

Assistant:

buddy_allocator(size_t memory_size)
	{
		assert(sizeof(*this) <= memory_size);
		assert(sizeof(page) <= alignment * 2);
		assert(sizeof(*this) % alignment == 0);
		memory_size_ = memory_size - sizeof(*this);
		max_bit_size_ = -1;
		memset(free_list_,0,sizeof(free_list_));
		LOG("Usable memory %zd",memory_size_);
		char *pos = memory();
		size_t reminder = memory_size_;
		for(;;) {
			int bits = containts_bits(reminder);
			if(bits < alignment_bits + 1)
				break;
			size_t page_size = size_t(1) << bits;
			page *p=reinterpret_cast<page *>(pos);
			reminder -= page_size;
			LOG("Added chunk of size %zd (%d) at pos %zx reminder %zd",page_size,bits,pos - memory(),reminder);
			pos+= page_size;
			p->bits = bits;
			p->prev = 0;
			p->next = 0;
			free_list_[bits] = p;
			if(max_bit_size_ == -1)
				max_bit_size_ = bits;
		}
	}